

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Contact.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::ContactConstraint::calcPositionError
          (ContactConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *errSysUpd,
          ConstraintCache *cache,bool updateKinematics)

{
  bool bVar1;
  reference pvVar2;
  Scalar *pSVar3;
  size_type in_RDX;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RDI;
  long in_R8;
  byte in_R9B;
  ReturnType RVar4;
  uint i;
  bool in_stack_0000015f;
  Vector3d *in_stack_00000160;
  uint in_stack_0000016c;
  VectorNd *in_stack_00000170;
  Model *in_stack_00000178;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_ffffffffffffff48;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff70;
  value_type vVar5;
  reference local_80;
  uint local_6c;
  byte local_31;
  long local_30;
  
  local_31 = in_R9B & 1;
  local_30 = in_R8;
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),0);
  vVar5 = *pvVar2;
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)(in_RDI + 0x50),0);
  CalcBodyToBaseCoordinates
            (in_stack_00000178,in_stack_00000170,in_stack_0000016c,in_stack_00000160,
             in_stack_0000015f);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_RDI,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                    CONCAT44(vVar5,in_stack_ffffffffffffff70));
  Vector3_t::operator=((Vector3_t *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  for (local_6c = 0; local_6c < *(uint *)(in_RDI + 0x30); local_6c = local_6c + 1) {
    local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT44(vVar5,in_stack_ffffffffffffff70),in_RDX);
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_80);
    if (bVar1) {
      in_stack_ffffffffffffff50 =
           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(local_30 + 0x50);
      std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
                ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RDI + 0xd8),(ulong)local_6c);
      RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
              dot<Eigen::Matrix<double,3,1,0,3,1>>
                        (in_stack_ffffffffffffff50,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         in_stack_ffffffffffffff48);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffff50,(Index)in_stack_ffffffffffffff48);
      *pSVar3 = RVar4;
    }
    else {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_ffffffffffffff50,(Index)in_stack_ffffffffffffff48);
      *pSVar3 = 0.0;
    }
  }
  return;
}

Assistant:

void ContactConstraint::calcPositionError(Model &model,
                                                      const double time,
                                                      const Math::VectorNd &Q,
                                                      Math::VectorNd &errSysUpd,
                                                      ConstraintCache &cache,
                                                      bool updateKinematics)
{
  cache.vec3A = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                          updateKinematics)  - groundPoint;
  for(unsigned int i = 0; i < sizeOfConstraint; ++i){
    if(positionConstraint[i]){
      errSysUpd[rowInSystem+i] = cache.vec3A.dot( T[i] );
    }else{
      errSysUpd[rowInSystem+i] = 0.;
    }
  }
}